

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O3

Expression * __thiscall MathInterpreter::fromStringToExpression(MathInterpreter *this)

{
  bool bVar1;
  int iVar2;
  Variable *this_00;
  iterator iVar3;
  mapped_type *ppVVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  undefined **ppuVar7;
  undefined8 *puVar8;
  MathInterpreter *pMVar9;
  pointer pcVar10;
  double value_arg;
  undefined1 local_b0 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  local_a0;
  string local_70;
  undefined1 local_50 [8];
  string temp;
  
  temp._M_dataplus._M_p = (pointer)0x0;
  temp._M_string_length._0_1_ = 0;
  local_50 = (undefined1  [8])&temp._M_string_length;
  std::__cxx11::string::_M_assign((string *)local_50);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(this->postfix_expression);
  pMVar9 = (MathInterpreter *)local_b0;
  local_b0._0_8_ = &local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pMVar9,local_50,temp._M_dataplus._M_p + (long)local_50);
  bVar1 = isNumber(pMVar9,(string *)local_b0);
  if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
       *)local_b0._0_8_ != &local_a0) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_a0._M_t._M_impl._0_8_ + 1));
  }
  if (bVar1) {
    this_00 = (Variable *)operator_new(0x10);
    pcVar10 = (pointer)atof((char *)local_50);
    (this_00->super_Expression)._vptr_Expression = (_func_int **)&PTR_calculate_00116a80;
    (this_00->name)._M_dataplus._M_p = pcVar10;
  }
  else {
    pMVar9 = (MathInterpreter *)((long)&local_a0 + 0x10);
    local_a0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)((long)&local_a0 + 0x20U);
    std::__cxx11::string::_M_construct<char*>
              ((string *)pMVar9,local_50,temp._M_dataplus._M_p + (long)local_50);
    bVar1 = isVariable(pMVar9,(string *)((long)&local_a0 + 0x10));
    if (local_a0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)((long)&local_a0 + 0x20U)) {
      operator_delete(local_a0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                      (long)local_a0._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 1);
    }
    if (bVar1) {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
              ::find(&this->variables->_M_t,(key_type *)local_50);
      if ((_Rb_tree_header *)iVar3._M_node == &(this->variables->_M_t)._M_impl.super__Rb_tree_header
         ) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = "illegal use of variable!";
        __cxa_throw(puVar8,&char_const*::typeinfo,0);
      }
      this_00 = (Variable *)operator_new(0x70);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_50,temp._M_dataplus._M_p + (long)local_50);
      ppVVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
                ::at(this->variables,(key_type *)local_50);
      (**((*ppVVar4)->super_Expression)._vptr_Expression)();
      Variable::Variable(this_00,&local_70,value_arg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare(local_50);
      if (iVar2 == 0) {
        this_00 = (Variable *)operator_new(0x10);
        pEVar5 = fromStringToExpression(this);
        (this_00->name)._M_dataplus._M_p = (pointer)pEVar5;
        ppuVar7 = &PTR_calculate_00116c38;
      }
      else {
        iVar2 = std::__cxx11::string::compare(local_50);
        if (iVar2 == 0) {
          this_00 = (Variable *)operator_new(0x10);
          pEVar5 = fromStringToExpression(this);
          (this_00->name)._M_dataplus._M_p = (pointer)pEVar5;
          ppuVar7 = &PTR_calculate_00116c90;
        }
        else {
          iVar2 = std::__cxx11::string::compare(local_50);
          if (iVar2 == 0) {
            pEVar5 = fromStringToExpression(this);
            pEVar6 = fromStringToExpression(this);
            this_00 = (Variable *)operator_new(0x18);
            (this_00->name)._M_dataplus._M_p = (pointer)pEVar6;
            (this_00->name)._M_string_length = (size_type)pEVar5;
            ppuVar7 = &PTR_calculate_00116b20;
          }
          else {
            iVar2 = std::__cxx11::string::compare(local_50);
            if (iVar2 == 0) {
              pEVar5 = fromStringToExpression(this);
              pEVar6 = fromStringToExpression(this);
              this_00 = (Variable *)operator_new(0x18);
              (this_00->name)._M_dataplus._M_p = (pointer)pEVar6;
              (this_00->name)._M_string_length = (size_type)pEVar5;
              ppuVar7 = &PTR_calculate_00116b78;
            }
            else {
              iVar2 = std::__cxx11::string::compare(local_50);
              if (iVar2 == 0) {
                pEVar5 = fromStringToExpression(this);
                pEVar6 = fromStringToExpression(this);
                this_00 = (Variable *)operator_new(0x18);
                (this_00->name)._M_dataplus._M_p = (pointer)pEVar6;
                (this_00->name)._M_string_length = (size_type)pEVar5;
                ppuVar7 = &PTR_calculate_00116bb8;
              }
              else {
                iVar2 = std::__cxx11::string::compare(local_50);
                if (iVar2 != 0) {
                  this_00 = (Variable *)0x0;
                  goto LAB_0010e253;
                }
                pEVar5 = fromStringToExpression(this);
                pEVar6 = fromStringToExpression(this);
                this_00 = (Variable *)operator_new(0x18);
                (this_00->name)._M_dataplus._M_p = (pointer)pEVar6;
                (this_00->name)._M_string_length = (size_type)pEVar5;
                ppuVar7 = &PTR_calculate_00116bf8;
              }
            }
          }
        }
      }
      (this_00->super_Expression)._vptr_Expression = (_func_int **)ppuVar7;
    }
  }
LAB_0010e253:
  if (local_50 != (undefined1  [8])&temp._M_string_length) {
    operator_delete((void *)local_50,
                    CONCAT71(temp._M_string_length._1_7_,(undefined1)temp._M_string_length) + 1);
  }
  return &this_00->super_Expression;
}

Assistant:

Expression *MathInterpreter::fromStringToExpression() {
  string temp;
  Expression *right, *left;
  temp = this->postfix_expression->back();
  this->postfix_expression->pop_back();
  if (isNumber(temp)) {
    return new Value(atof(temp.c_str()));
  } else if (isVariable(temp)) {
    if (this->variables->find(temp) == this->variables->end()) {
      throw ("illegal use of variable!");
    }
    return new Variable(temp, this->variables->at(temp)->calculate());
  } else if (temp == "@") {
    return new UPlus(fromStringToExpression());
  } else if (temp == "$") {
    return new UMinus(fromStringToExpression());
  } else if (temp == "+") {
    right = fromStringToExpression();
    left = fromStringToExpression();
    return new Plus(left, right);
  } else if (temp == "-") {
    right = fromStringToExpression();
    left = fromStringToExpression();
    return new Minus(left, right);
  } else if (temp == "*") {
    right = fromStringToExpression();
    left = fromStringToExpression();
    return new Mul(left, right);
  } else if (temp == "/") {
    right = fromStringToExpression();
    left = fromStringToExpression();
    return new Div(left, right);
  }
  return nullptr;
}